

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O3

SN_ELEMENT * __thiscall
ON_SerialNumberMap::Internal_HashTableFindId
          (ON_SerialNumberMap *this,ON_UUID id,ON__UINT32 id_crc32,bool bBuildTableIfNeeded)

{
  ON_SN_BLOCK *pOVar1;
  ON__UINT64 *q;
  SN_ELEMENT *pSVar2;
  long lVar3;
  
  if (this->m_bHashTableIsValid == '\0') {
    pOVar1 = this->m_sn_block0;
    lVar3 = 0;
    do {
      if ((ulong)pOVar1->m_count * 0x38 - lVar3 == 0) break;
      if (((*(long *)(pOVar1->m_sn[0].m_id.Data4 + lVar3 + -8) == id._0_8_) &&
          (*(uchar (*) [8])(pOVar1->m_sn[0].m_id.Data4 + lVar3) == id.Data4)) &&
         (*(char *)((long)(&pOVar1->m_sn[0].m_id + 1) + lVar3 + 9) != '\0')) {
        return (SN_ELEMENT *)(pOVar1->m_sn[0].m_id.Data4 + lVar3 + -8);
      }
      lVar3 = lVar3 + 0x38;
    } while (lVar3 != 0x1c0);
    if (!bBuildTableIfNeeded) {
      return (SN_ELEMENT *)0x0;
    }
    Internal_HashTableBuild(this);
    if (this->m_bHashTableIsValid == '\0') {
      return (SN_ELEMENT *)0x0;
    }
  }
  pSVar2 = this->m_hash_table_blocks[(ulong)id_crc32 % (ulong)this->m_hash_block_count]
           [id_crc32 / 0xffa + (id_crc32 / 0xff4024) * -0xffa];
  while( true ) {
    if (pSVar2 == (SN_ELEMENT *)0x0) {
      return (SN_ELEMENT *)0x0;
    }
    lVar3._0_4_ = (pSVar2->m_id).Data1;
    lVar3._4_2_ = (pSVar2->m_id).Data2;
    lVar3._6_2_ = (pSVar2->m_id).Data3;
    if ((lVar3 == id._0_8_) && (*&(pSVar2->m_id).Data4 == id.Data4)) break;
    pSVar2 = pSVar2->m_next;
  }
  return pSVar2;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::Internal_HashTableFindId(
  ON_UUID id,
  ON__UINT32 id_crc32,
  bool bBuildTableIfNeeded
  ) const
{
  // Caller checks that m_active_id_count > 0 && id != nil && id != m_inactive_id

  if (false == m_bHashTableIsValid)
  {
    for (ON__UINT32 i = 0; i < 8 && i < m_sn_block0.m_count; i++)
    {
      if ( IdIsEqual(&id,&m_sn_block0.m_sn[i].m_id) )
      {
        ON_SerialNumberMap::SN_ELEMENT* e = const_cast<ON_SerialNumberMap::SN_ELEMENT*>(&m_sn_block0.m_sn[i]);
        if ( 0 != e->m_id_active )
          return e;
      }
    }
    if ( false == bBuildTableIfNeeded )
      return nullptr;

    // expensive
    Internal_HashTableBuild();
    if ( false == m_bHashTableIsValid )
      return nullptr;
  }

  for (
    ON_SerialNumberMap::SN_ELEMENT* e = m_hash_table_blocks[id_crc32 % m_hash_block_count][(id_crc32 / ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY) % ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY];
    nullptr != e;
    e = e->m_next
    )
  {
    if ( IdIsEqual(&id,&e->m_id) )
      return e;
  }

  return nullptr;
}